

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TestSpec *pTVar3;
  ostream *poVar4;
  ITagAliasRegistry *tagAliases;
  TestSpecParser *this;
  TextAttributes *this_00;
  IRegistryHub *pIVar5;
  undefined4 extraout_var_00;
  pointer this_01;
  ostream *poVar6;
  allocator local_2c1;
  string local_2c0 [32];
  pluralise local_2a0;
  allocator local_271;
  string local_270 [32];
  pluralise local_250;
  Text local_228;
  Text local_1d0;
  Colour local_175;
  Code local_174;
  Colour colourGuard;
  TestCaseInfo *pTStack_170;
  Code colour;
  TestCaseInfo *testCaseInfo;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_160;
  const_iterator itEnd;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_150;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TextAttributes tagsAttr;
  TextAttributes nameAttr;
  size_t matchedTests;
  string local_e0 [32];
  TestSpecParser local_c0;
  TestSpec local_50;
  undefined1 local_28 [8];
  TestSpec testSpec;
  Config *config_local;
  
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)config;
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  TestSpec::TestSpec((TestSpec *)local_28,(TestSpec *)CONCAT44(extraout_var,iVar2));
  pTVar3 = (TestSpec *)
           (*(code *)((testSpec.m_filters.
                       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                     super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[0xd].m_p)();
  bVar1 = TestSpec::hasFilters(pTVar3);
  if (bVar1) {
    poVar4 = cout();
    std::operator<<((ostream *)poVar4,"Matching test cases:\n");
  }
  else {
    poVar4 = cout();
    std::operator<<((ostream *)poVar4,"All available test cases:\n");
    tagAliases = ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser(&local_c0,tagAliases);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"*",(allocator *)((long)&matchedTests + 7));
    this = TestSpecParser::parse(&local_c0,(string *)local_e0);
    TestSpecParser::testSpec(&local_50,this);
    TestSpec::operator=((TestSpec *)local_28,&local_50);
    TestSpec::~TestSpec(&local_50);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&matchedTests + 7));
    TestSpecParser::~TestSpecParser(&local_c0);
  }
  nameAttr.tabChar = '\0';
  nameAttr._25_7_ = 0;
  Tbc::TextAttributes::TextAttributes((TextAttributes *)&tagsAttr.tabChar);
  Tbc::TextAttributes::TextAttributes
            ((TextAttributes *)
             &matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = Tbc::TextAttributes::setInitialIndent((TextAttributes *)&tagsAttr.tabChar,2);
  Tbc::TextAttributes::setIndent(this_00,4);
  Tbc::TextAttributes::setIndent
            ((TextAttributes *)
             &matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,6);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  pIVar5 = getRegistryHub();
  iVar2 = (*pIVar5->_vptr_IRegistryHub[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
            ((long *)CONCAT44(extraout_var_00,iVar2),local_28,
             testSpec.m_filters.
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,&it,0);
  itEnd._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_150,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)&itEnd);
  testCaseInfo = (TestCaseInfo *)
                 std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                           ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_160,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)&testCaseInfo);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_150,&local_160);
    if (!bVar1) break;
    nameAttr._24_8_ = nameAttr._24_8_ + 1;
    this_01 = __gnu_cxx::
              __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              ::operator->(&local_150);
    pTStack_170 = TestCase::getTestCaseInfo(this_01);
    bVar1 = TestCaseInfo::isHidden(pTStack_170);
    local_174 = None;
    if (bVar1) {
      local_174 = FileName;
    }
    Colour::Colour(&local_175,local_174);
    poVar4 = cout();
    Tbc::Text::Text(&local_1d0,&pTStack_170->name,(TextAttributes *)&tagsAttr.tabChar);
    poVar4 = Tbc::operator<<(poVar4,&local_1d0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Tbc::Text::~Text(&local_1d0);
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pTStack_170->tags);
    if (!bVar1) {
      poVar4 = cout();
      Tbc::Text::Text(&local_228,&pTStack_170->tagsAsString,
                      (TextAttributes *)
                      &matchedTestCases.
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
      poVar4 = Tbc::operator<<(poVar4,&local_228);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Tbc::Text::~Text(&local_228);
    }
    Colour::~Colour(&local_175);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_150);
  }
  pTVar3 = (TestSpec *)
           (*(code *)((testSpec.m_filters.
                       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                     super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[0xd].m_p)();
  bVar1 = TestSpec::hasFilters(pTVar3);
  if (bVar1) {
    poVar4 = cout();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"matching test case",&local_2c1);
    pluralise::pluralise(&local_2a0,nameAttr._24_8_,(string *)local_2c0);
    poVar4 = operator<<(poVar4,&local_2a0);
    poVar6 = std::operator<<((ostream *)poVar4,"\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_2a0);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  }
  else {
    poVar4 = cout();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"test case",&local_271);
    pluralise::pluralise(&local_250,nameAttr._24_8_,(string *)local_270);
    poVar4 = operator<<(poVar4,&local_250);
    poVar6 = std::operator<<((ostream *)poVar4,"\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_250);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  TestSpec::~TestSpec((TestSpec *)local_28);
  return nameAttr._24_8_;
}

Assistant:

inline std::size_t listTests( Config const& config ) {

        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::size_t matchedTests = 0;
        TextAttributes nameAttr, tagsAttr;
        nameAttr.setInitialIndent( 2 ).setIndent( 4 );
        tagsAttr.setIndent( 6 );

        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Text( testCaseInfo.name, nameAttr ) << std::endl;
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Text( testCaseInfo.tagsAsString, tagsAttr ) << std::endl;
        }

        if( !config.testSpec().hasFilters() )
            Catch::cout() << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            Catch::cout() << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }